

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsharedpointer.cpp
# Opt level: O0

QSharedPointer<QObject> QtSharedPointer::sharedPointerFromVariant_internal(QVariant *variant)

{
  Data *extraout_RDX;
  totally_ordered_wrapper<QObject_*> in_RDI;
  QSharedPointer<QObject> QVar1;
  QSharedPointer<QObject> *in_stack_ffffffffffffffd8;
  totally_ordered_wrapper<QObject_*> this;
  
  this.ptr = in_RDI.ptr;
  ::QVariant::constData((QVariant *)0x62fa89);
  QSharedPointer<QObject>::QSharedPointer
            ((QSharedPointer<QObject> *)this.ptr,in_stack_ffffffffffffffd8);
  QVar1.d = extraout_RDX;
  QVar1.value.ptr = in_RDI.ptr;
  return QVar1;
}

Assistant:

QSharedPointer<QObject> QtSharedPointer::sharedPointerFromVariant_internal(const QVariant &variant)
{
    Q_ASSERT(variant.metaType().flags() & QMetaType::SharedPointerToQObject);
    return *reinterpret_cast<const QSharedPointer<QObject>*>(variant.constData());
}